

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-gvec.c
# Opt level: O0

void expand_4_vec(TCGContext_conflict9 *tcg_ctx,uint vece,uint32_t dofs,uint32_t aofs,uint32_t bofs,
                 uint32_t cofs,uint32_t oprsz,uint32_t tysz,TCGType_conflict type,_Bool write_aofs,
                 _func_void_TCGContext_ptr_uint_TCGv_vec_TCGv_vec_TCGv_vec_TCGv_vec_conflict9 *fni)

{
  TCGv_vec arg;
  TCGv_vec arg_00;
  TCGv_vec arg_01;
  TCGv_vec arg_02;
  uint local_4c;
  uint32_t i;
  TCGv_vec t3;
  TCGv_vec t2;
  TCGv_vec t1;
  TCGv_vec t0;
  _Bool write_aofs_local;
  uint32_t cofs_local;
  uint32_t bofs_local;
  uint32_t aofs_local;
  uint32_t dofs_local;
  uint vece_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  arg = tcg_temp_new_vec_tricore(tcg_ctx,type);
  arg_00 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  arg_01 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  arg_02 = tcg_temp_new_vec_tricore(tcg_ctx,type);
  for (local_4c = 0; local_4c < oprsz; local_4c = tysz + local_4c) {
    tcg_gen_ld_vec_tricore(tcg_ctx,arg_00,tcg_ctx->cpu_env,(ulong)(aofs + local_4c));
    tcg_gen_ld_vec_tricore(tcg_ctx,arg_01,tcg_ctx->cpu_env,(ulong)(bofs + local_4c));
    tcg_gen_ld_vec_tricore(tcg_ctx,arg_02,tcg_ctx->cpu_env,(ulong)(cofs + local_4c));
    (*fni)(tcg_ctx,vece,arg,arg_00,arg_01,arg_02);
    tcg_gen_st_vec_tricore(tcg_ctx,arg,tcg_ctx->cpu_env,(ulong)(dofs + local_4c));
    if (write_aofs) {
      tcg_gen_st_vec_tricore(tcg_ctx,arg_00,tcg_ctx->cpu_env,(ulong)(aofs + local_4c));
    }
  }
  tcg_temp_free_vec(tcg_ctx,arg_02);
  tcg_temp_free_vec(tcg_ctx,arg_01);
  tcg_temp_free_vec(tcg_ctx,arg_00);
  tcg_temp_free_vec(tcg_ctx,arg);
  return;
}

Assistant:

static void expand_4_vec(TCGContext *tcg_ctx, unsigned vece, uint32_t dofs, uint32_t aofs,
                         uint32_t bofs, uint32_t cofs, uint32_t oprsz,
                         uint32_t tysz, TCGType type, bool write_aofs,
                         void (*fni)(TCGContext *, unsigned, TCGv_vec, TCGv_vec,
                                     TCGv_vec, TCGv_vec))
{
    TCGv_vec t0 = tcg_temp_new_vec(tcg_ctx, type);
    TCGv_vec t1 = tcg_temp_new_vec(tcg_ctx, type);
    TCGv_vec t2 = tcg_temp_new_vec(tcg_ctx, type);
    TCGv_vec t3 = tcg_temp_new_vec(tcg_ctx, type);
    uint32_t i;

    for (i = 0; i < oprsz; i += tysz) {
        tcg_gen_ld_vec(tcg_ctx, t1, tcg_ctx->cpu_env, aofs + i);
        tcg_gen_ld_vec(tcg_ctx, t2, tcg_ctx->cpu_env, bofs + i);
        tcg_gen_ld_vec(tcg_ctx, t3, tcg_ctx->cpu_env, cofs + i);
        fni(tcg_ctx, vece, t0, t1, t2, t3);
        tcg_gen_st_vec(tcg_ctx, t0, tcg_ctx->cpu_env, dofs + i);
        if (write_aofs) {
            tcg_gen_st_vec(tcg_ctx, t1, tcg_ctx->cpu_env, aofs + i);
        }
    }
    tcg_temp_free_vec(tcg_ctx, t3);
    tcg_temp_free_vec(tcg_ctx, t2);
    tcg_temp_free_vec(tcg_ctx, t1);
    tcg_temp_free_vec(tcg_ctx, t0);
}